

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastcgi_api.cpp
# Opt level: O3

const_buffer * __thiscall
cppcms::impl::cgi::fastcgi::format_output
          (const_buffer *__return_storage_ptr__,fastcgi *this,const_buffer *input,bool completed,
          error_code *param_3)

{
  pointer peVar1;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  ushort uVar5;
  undefined7 in_register_00000009;
  size_t *psVar6;
  uint uVar7;
  ulong uVar8;
  ulong s;
  entry *peVar9;
  size_t sVar10;
  bool bVar11;
  const_buffer *packet;
  const_buffer tmp_3;
  const_buffer tmp;
  buffer_impl<const_char_*> local_f8;
  undefined4 local_bc;
  buffer_impl<char_*> local_b8;
  size_t local_88;
  ulong local_80;
  ulong local_78;
  entry eStack_70;
  vector<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  local_60;
  fcgi_header *local_40;
  fcgi_header *local_38;
  
  local_78 = local_78 & 0xffffffff00000000;
  local_60.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (entry *)0x0;
  local_60.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_bc = (undefined4)CONCAT71(in_register_00000009,completed);
  if (this->response_headers_written_ == false) {
    local_b8.size_ = 0;
    local_b8.vec_.
    super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.vec_.
    super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.vec_.
    super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    booster::aio::buffer_impl<const_char_*>::add
              ((buffer_impl<const_char_*> *)&local_b8,(this->response_headers_)._M_dataplus._M_p,
               (this->response_headers_)._M_string_length);
    local_f8.entry_.size = local_b8.entry_.size;
    local_f8._0_8_ = CONCAT44(local_b8._4_4_,local_b8.size_);
    local_f8.entry_.ptr = local_b8.entry_.ptr;
    std::
    vector<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
    ::vector(&local_f8.vec_,
             (vector<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
              *)&local_b8.vec_);
    booster::aio::details::add<booster::aio::const_buffer>((const_buffer *)&local_f8,input);
    peVar1 = local_60.
             super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    eStack_70.size = local_f8.entry_.size;
    local_78 = local_f8._0_8_;
    eStack_70.ptr = local_f8.entry_.ptr;
    local_60.
    super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_f8.vec_.
         super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_60.
    super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_f8.vec_.
         super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_60.
    super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_f8.vec_.
         super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_f8.vec_.
    super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_start = (entry *)0x0;
    local_f8.vec_.
    super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8.vec_.
    super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (peVar1 != (entry *)0x0) {
      operator_delete(peVar1);
      if (local_f8.vec_.
          super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
          ._M_impl.super__Vector_impl_data._M_start != (entry *)0x0) {
        operator_delete(local_f8.vec_.
                        super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    if (local_b8.vec_.
        super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.vec_.
                      super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    this->response_headers_written_ = true;
  }
  else {
    eStack_70.size = (input->super_buffer_impl<const_char_*>).entry_.size;
    local_78 = *(ulong *)&input->super_buffer_impl<const_char_*>;
    eStack_70.ptr = (input->super_buffer_impl<const_char_*>).entry_.ptr;
    std::
    vector<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
    ::operator=(&local_60,&(input->super_buffer_impl<const_char_*>).vec_);
  }
  (__return_storage_ptr__->super_buffer_impl<const_char_*>).size_ = 0;
  (__return_storage_ptr__->super_buffer_impl<const_char_*>).vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_buffer_impl<const_char_*>).vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_buffer_impl<const_char_*>).vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((int)local_78 != 0) {
    if ((int)local_78 == 1) {
      sVar3 = eStack_70.size;
      peVar9 = &eStack_70;
    }
    else {
      if ((long)local_60.
                super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_60.
                super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                ._M_impl.super__Vector_impl_data._M_start == 0) goto LAB_002308f5;
      lVar2 = (long)local_60.
                    super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_60.
                    super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      lVar2 = lVar2 + (ulong)(lVar2 == 0);
      psVar6 = &(local_60.
                 super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                 ._M_impl.super__Vector_impl_data._M_start)->size;
      sVar3 = 0;
      do {
        sVar3 = sVar3 + *psVar6;
        psVar6 = psVar6 + 2;
        lVar2 = lVar2 + -1;
        peVar9 = local_60.
                 super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      } while (lVar2 != 0);
    }
    local_88 = sVar3;
    if (sVar3 != 0) {
      local_38 = &this->header_;
      local_40 = &this->full_header_;
      sVar10 = 0;
      do {
        if (sVar3 < 0x10000) {
          (this->header_).version = '\x01';
          (this->header_).type = '\x06';
          (this->header_).request_id = 0;
          (this->header_).content_length = 0;
          (this->header_).padding_length = '\0';
          (this->header_).reserved = '\0';
          uVar5 = (ushort)this->request_id_;
          uVar7 = -(int)sVar3 & 7;
          (this->header_).padding_length = (uchar)uVar7;
          (this->header_).request_id = uVar5 << 8 | uVar5 >> 8;
          (this->header_).content_length = (ushort)sVar3 << 8 | (ushort)sVar3 >> 8;
          local_b8.size_ = 0;
          local_b8.vec_.
          super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_b8.vec_.
          super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_b8.vec_.
          super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          booster::aio::buffer_impl<char_*>::add(&local_b8,(char *)local_38,8);
          booster::aio::const_buffer::const_buffer
                    ((const_buffer *)&local_f8,(mutable_buffer *)&local_b8);
          booster::aio::details::add<booster::aio::const_buffer>
                    (__return_storage_ptr__,(const_buffer *)&local_f8);
          if (local_f8.vec_.
              super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
              ._M_impl.super__Vector_impl_data._M_start != (entry *)0x0) {
            operator_delete(local_f8.vec_.
                            super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_b8.vec_.
              super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b8.vec_.
                            super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          local_80 = (ulong)uVar7;
          uVar8 = sVar3;
        }
        else {
          if (sVar3 == local_88) {
            (this->full_header_).version = '\x01';
            (this->full_header_).type = '\x06';
            uVar5 = (ushort)this->request_id_;
            (this->full_header_).padding_length = '\x01';
            (this->full_header_).request_id = uVar5 << 8 | uVar5 >> 8;
            (this->full_header_).content_length = 0xffff;
          }
          local_b8.size_ = 0;
          local_b8.vec_.
          super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_b8.vec_.
          super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_b8.vec_.
          super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          booster::aio::buffer_impl<char_*>::add(&local_b8,(char *)local_40,8);
          booster::aio::const_buffer::const_buffer
                    ((const_buffer *)&local_f8,(mutable_buffer *)&local_b8);
          booster::aio::details::add<booster::aio::const_buffer>
                    (__return_storage_ptr__,(const_buffer *)&local_f8);
          if (local_f8.vec_.
              super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
              ._M_impl.super__Vector_impl_data._M_start != (entry *)0x0) {
            operator_delete(local_f8.vec_.
                            super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_b8.vec_.
              super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b8.vec_.
                            super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          local_80 = 1;
          uVar8 = 0xffff;
        }
        sVar3 = sVar3 - uVar8;
        do {
          s = peVar9->size - sVar10;
          if (uVar8 <= s) {
            s = uVar8;
          }
          local_f8._0_8_ = local_f8._0_8_ & 0xffffffff00000000;
          local_f8.vec_.
          super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_f8.vec_.
          super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_f8.vec_.
          super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          booster::aio::buffer_impl<const_char_*>::add(&local_f8,peVar9->ptr + sVar10,s);
          booster::aio::details::add<booster::aio::const_buffer>
                    (__return_storage_ptr__,(const_buffer *)&local_f8);
          if (local_f8.vec_.
              super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_f8.vec_.
                            super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          sVar4 = sVar10 + s;
          bVar11 = sVar4 == peVar9->size;
          sVar10 = 0;
          if (!bVar11) {
            sVar10 = sVar4;
          }
          peVar9 = peVar9 + bVar11;
          uVar8 = uVar8 - s;
        } while (uVar8 != 0);
        local_f8._0_8_ = local_f8._0_8_ & 0xffffffff00000000;
        local_f8.vec_.
        super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
        ._M_impl.super__Vector_impl_data._M_start = (entry *)0x0;
        local_f8.vec_.
        super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_f8.vec_.
        super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        booster::aio::buffer_impl<const_char_*>::add(&local_f8,"",local_80);
        booster::aio::details::add<booster::aio::const_buffer>
                  (__return_storage_ptr__,(const_buffer *)&local_f8);
        if (local_f8.vec_.
            super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
            ._M_impl.super__Vector_impl_data._M_start != (entry *)0x0) {
          operator_delete(local_f8.vec_.
                          super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
      } while (sVar3 != 0);
    }
  }
LAB_002308f5:
  if ((char)local_bc != '\0') {
    (this->eof_).headers_[0].version = '\0';
    (this->eof_).headers_[0].type = '\0';
    (this->eof_).headers_[0].request_id = 0;
    (this->eof_).headers_[0].content_length = 0;
    (this->eof_).headers_[0].padding_length = '\0';
    (this->eof_).headers_[0].reserved = '\0';
    (this->eof_).headers_[1].version = '\0';
    (this->eof_).headers_[1].type = '\0';
    (this->eof_).headers_[1].request_id = 0;
    (this->eof_).headers_[1].content_length = 0;
    (this->eof_).headers_[1].padding_length = '\0';
    (this->eof_).headers_[1].reserved = '\0';
    (this->eof_).record_.app_status = 0;
    (this->eof_).record_.protocol_status = '\0';
    (this->eof_).record_.reserved[0] = '\0';
    (this->eof_).record_.reserved[1] = '\0';
    (this->eof_).record_.reserved[2] = '\0';
    uVar5 = (ushort)this->request_id_;
    (this->eof_).headers_[0].version = '\x01';
    (this->eof_).headers_[0].type = '\x06';
    uVar5 = uVar5 << 8 | uVar5 >> 8;
    (this->eof_).headers_[1].version = '\x01';
    (this->eof_).headers_[1].type = '\x03';
    (this->eof_).headers_[0].request_id = uVar5;
    (this->eof_).headers_[1].request_id = uVar5;
    (this->eof_).headers_[1].content_length = 0x800;
    local_b8.size_ = 0;
    local_b8.vec_.
    super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.vec_.
    super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.vec_.
    super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    booster::aio::buffer_impl<char_*>::add(&local_b8,(char *)&this->eof_,0x18);
    booster::aio::const_buffer::const_buffer((const_buffer *)&local_f8,(mutable_buffer *)&local_b8);
    booster::aio::details::add<booster::aio::const_buffer>
              (__return_storage_ptr__,(const_buffer *)&local_f8);
    if (local_f8.vec_.
        super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
        ._M_impl.super__Vector_impl_data._M_start != (entry *)0x0) {
      operator_delete(local_f8.vec_.
                      super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_b8.vec_.
        super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.vec_.
                      super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_60.
      super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
      ._M_impl.super__Vector_impl_data._M_start != (entry *)0x0) {
    operator_delete(local_60.
                    super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual booster::aio::const_buffer format_output(booster::aio::const_buffer const &input,bool completed,booster::system::error_code &)
		{
			booster::aio::const_buffer in;
			if(!response_headers_written_) {
				in=booster::aio::buffer(response_headers_) + input;
				response_headers_written_ = true;
			}
			else {
				in = input;
			}
			booster::aio::const_buffer packet;
			booster::aio::const_buffer::entry const *chunks = in.get().first;
//#define DEBUG_FASTCGI
#ifdef DEBUG_FASTCGI
			{
				size_t n=in.get().second;
				printf("Format output of %d:\n",int(in.bytes_count()));
				for(size_t i=0;i<n;i++) {
					printf("[%.*s]",int(chunks[i].size),chunks[i].ptr);
				}
				if(completed) {
					printf("\nEOF\n");
				}
				else {
					printf("\n---\n");
				}
			}
#endif
			size_t reminder = in.bytes_count();
			size_t in_size = reminder;
			size_t chunk_consumed = 0;
			while(reminder > 0) {
				static const char pad[8]={0,0,0,0,0,0,0,0};
				static const size_t max_packet_len = 65535;
				size_t chunk = 0;
				int pad_len = 0;
				if(reminder > max_packet_len) {
					chunk = max_packet_len;
					if(in_size > max_packet_len && reminder == in_size) {
						// prepare only once
						full_header_.version = fcgi_version_1;
						full_header_.type=fcgi_stdout;
						full_header_.request_id=request_id_;
						full_header_.content_length = max_packet_len;
						full_header_.padding_length = pad_len = 1;
						full_header_.to_net();
					}
					else {
						pad_len = 1;
					}
					packet += io::buffer(&full_header_,sizeof(full_header_));
				}
				else {
					chunk = reminder;
					memset(&header_,0,sizeof(header_));
					header_.version=fcgi_version_1;
					header_.type=fcgi_stdout;
					header_.request_id=request_id_;
					header_.content_length = reminder;
					header_.padding_length =pad_len = (8 - (reminder % 8)) % 8;
					header_.to_net();

					packet += io::buffer(&header_,sizeof(header_));
				}

				reminder -= chunk;
				while(chunk > 0) {
					size_t next_size = chunks->size - chunk_consumed;
					if(next_size > chunk)
						next_size = chunk;

					packet += io::buffer(chunks->ptr + chunk_consumed, next_size);
					chunk_consumed += next_size;
					chunk -= next_size;
					if(chunk_consumed == chunks->size) {
						chunks++;
						chunk_consumed = 0;
					}
				}

				packet += io::buffer(pad,pad_len);
			}
			if(completed) {
				prepare_eof();
				packet += io::buffer(&eof_,sizeof(eof_));
			}
			#ifdef DEBUG_FASTCGI
			std::pair<booster::aio::const_buffer::entry const *,size_t> cnk = packet.get();
			for(size_t i=0;i<cnk.second;i++) {
				std::cerr << "[ " << (void const *)(cnk.first[i].ptr) << " " << cnk.first[i].size << "]\n" << std::endl;
			}
			#endif
			return packet;
		}